

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview_p.h
# Opt level: O1

QBitArray * __thiscall
QHeaderViewPrivate::sectionsHiddenToBitVector
          (QBitArray *__return_storage_ptr__,QHeaderViewPrivate *this)

{
  Data *pDVar1;
  ulong i;
  
  (__return_storage_ptr__->d).d.d = (Data *)0x0;
  (__return_storage_ptr__->d).d.ptr = (char *)0x0;
  (__return_storage_ptr__->d).d.size = 0;
  pDVar1 = (this->hiddenSectionSize).d;
  if ((pDVar1 != (Data *)0x0) && (pDVar1->size != 0)) {
    QBitArray::resize((longlong)__return_storage_ptr__);
    if ((this->sectionItems).d.size != 0) {
      i = 0;
      do {
        QBitArray::setBit(__return_storage_ptr__,i,
                          (bool)((byte)(*(uint *)((this->sectionItems).d.ptr + i) >> 0x14) & 1));
        i = i + 1;
      } while (i < (ulong)(this->sectionItems).d.size);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QBitArray sectionsHiddenToBitVector() const
    {
        QBitArray sectionHidden;
        if (!hiddenSectionSize.isEmpty()) {
            sectionHidden.resize(sectionItems.size());
            for (int u = 0; u < sectionItems.size(); ++u)
                sectionHidden[u] = sectionItems.at(u).isHidden;
        }
        return sectionHidden;
    }